

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O0

void __thiscall asmjit::v1_14::ZoneBitVector::release(ZoneBitVector *this,ZoneAllocator *allocator)

{
  size_t in_RSI;
  long *in_RDI;
  ZoneAllocator *in_stack_fffffffffffffff8;
  
  if (*in_RDI != 0) {
    ZoneAllocator::release(in_stack_fffffffffffffff8,in_RDI,in_RSI);
    *in_RDI = 0;
    *(undefined4 *)(in_RDI + 1) = 0;
    *(undefined4 *)((long)in_RDI + 0xc) = 0;
  }
  return;
}

Assistant:

inline void release(ZoneAllocator* allocator) noexcept {
    if (!_data)
      return;
    allocator->release(_data, _capacity / 8);
    reset();
  }